

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

void __thiscall
cmStateDirectory::AppendProperty
          (cmStateDirectory *this,string *prop,char *value,bool asString,cmListFileBacktrace *lfbt)

{
  char *pcVar1;
  bool bVar2;
  PointerType pBVar3;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_51;
  string local_50;
  cmListFileBacktrace *local_30;
  cmListFileBacktrace *lfbt_local;
  char *pcStack_20;
  bool asString_local;
  char *value_local;
  string *prop_local;
  cmStateDirectory *this_local;
  
  local_30 = lfbt;
  lfbt_local._7_1_ = asString;
  pcStack_20 = value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  pcVar1 = pcStack_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,pcVar1,&local_51);
    AppendIncludeDirectoriesEntry(this,&local_50,local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"COMPILE_OPTIONS");
    pcVar1 = pcStack_20;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,pcVar1,&local_89);
      AppendCompileOptionsEntry(this,&local_88,local_30);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,"COMPILE_DEFINITIONS");
      pcVar1 = pcStack_20;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b0,pcVar1,&local_b1);
        AppendCompileDefinitionsEntry(this,&local_b0,local_30);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      }
      else {
        pBVar3 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           (&this->DirectoryState);
        cmPropertyMap::AppendProperty
                  (&pBVar3->Properties,(string *)value_local,pcStack_20,(bool)(lfbt_local._7_1_ & 1)
                  );
      }
    }
  }
  return;
}

Assistant:

void cmStateDirectory::AppendProperty(const std::string& prop,
                                      const char* value, bool asString,
                                      cmListFileBacktrace const& lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES") {
    this->AppendIncludeDirectoriesEntry(value, lfbt);
    return;
  }
  if (prop == "COMPILE_OPTIONS") {
    this->AppendCompileOptionsEntry(value, lfbt);
    return;
  }
  if (prop == "COMPILE_DEFINITIONS") {
    this->AppendCompileDefinitionsEntry(value, lfbt);
    return;
  }

  this->DirectoryState->Properties.AppendProperty(prop, value, asString);
}